

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ConditionalPredicateSyntax::ConditionalPredicateSyntax
          (ConditionalPredicateSyntax *this,
          SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *conditions)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  ConditionalPatternSyntax *pCVar4;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *__range2;
  iterator __begin2;
  iterator_base<slang::syntax::ConditionalPatternSyntax_*> local_30;
  
  (this->super_SyntaxNode).kind = ConditionalPredicate;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  uVar3 = *(undefined4 *)&(conditions->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (conditions->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->conditions).super_SyntaxListBase.super_SyntaxNode.kind =
       (conditions->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->conditions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->conditions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->conditions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (conditions->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->conditions).super_SyntaxListBase.childCount = (conditions->super_SyntaxListBase).childCount
  ;
  (this->conditions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002dad08;
  sVar1 = (conditions->elements)._M_extent._M_extent_value;
  (this->conditions).elements._M_ptr = (conditions->elements)._M_ptr;
  (this->conditions).elements._M_extent._M_extent_value = sVar1;
  (this->conditions).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  local_30.index = 0;
  sVar1 = (this->conditions).elements._M_extent._M_extent_value;
  local_30.list = &this->conditions;
  for (; (local_30.list != &this->conditions || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pCVar4 = SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::
             iterator_base<slang::syntax::ConditionalPatternSyntax_*>::dereference(&local_30);
    (pCVar4->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

ConditionalPredicateSyntax(const SeparatedSyntaxList<ConditionalPatternSyntax>& conditions) :
        SyntaxNode(SyntaxKind::ConditionalPredicate), conditions(conditions) {
        this->conditions.parent = this;
        for (auto child : this->conditions)
            child->parent = this;
    }